

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O3

void __thiscall stk::FileWrite::closeWavFile(FileWrite *this)

{
  uint uVar1;
  StkFormat SVar2;
  long __off;
  int iVar3;
  bool bVar4;
  undefined1 local_24 [4];
  
  SVar2 = this->dataType_;
  if (SVar2 == 2) {
    iVar3 = 0;
    bVar4 = false;
  }
  else {
    iVar3 = 3;
    bVar4 = true;
    if (((SVar2 != 4) && (iVar3 = 0, SVar2 != 8)) && (SVar2 != 0x10)) {
      bVar4 = SVar2 == 0x20;
      iVar3 = 1;
      if (bVar4) {
        iVar3 = 0;
      }
    }
  }
  uVar1 = this->channels_;
  __off = 0x28;
  if (2 < uVar1 || bVar4) {
    __off = 0x4c;
  }
  if ((uVar1 * iVar3 * (int)this->frameCounter_ & 1) != 0) {
    fputc(0,(FILE *)this->fd_);
  }
  fseek((FILE *)this->fd_,__off,0);
  fwrite(local_24,4,1,(FILE *)this->fd_);
  fseek((FILE *)this->fd_,4,0);
  fwrite(local_24,4,1,(FILE *)this->fd_);
  if (2 < uVar1 || bVar4) {
    fseek((FILE *)this->fd_,0x44,0);
    fwrite(local_24,4,1,(FILE *)this->fd_);
  }
  fclose((FILE *)this->fd_);
  return;
}

Assistant:

void FileWrite :: closeWavFile( void )
{
  int bytesPerSample = 1;
  if ( dataType_ == STK_SINT16 )
    bytesPerSample = 2;
  else if ( dataType_ == STK_SINT24 )
    bytesPerSample = 3;
  else if ( dataType_ == STK_SINT32 || dataType_ == STK_FLOAT32 )
    bytesPerSample = 4;
  else if ( dataType_ == STK_FLOAT64 )
    bytesPerSample = 8;

  bool useExtensible = false;
  int dataLocation = 40;
  if ( bytesPerSample > 2 || channels_ > 2 ) {
    useExtensible = true;
    dataLocation = 76;
  }

  SINT32 bytes = (SINT32) (frameCounter_ * channels_ * bytesPerSample);
  if ( bytes % 2 ) { // pad extra byte if odd
    signed char sample = 0;
    fwrite( &sample, 1, 1, fd_ );
  }
#ifndef __LITTLE_ENDIAN__
  swap32((unsigned char *)&bytes);
#endif
  fseek( fd_, dataLocation, SEEK_SET ); // jump to data length
  fwrite( &bytes, 4, 1, fd_ );

  bytes = (SINT32) (frameCounter_ * channels_ * bytesPerSample + 44);
  if ( useExtensible ) bytes += 36;
#ifndef __LITTLE_ENDIAN__
  swap32((unsigned char *)&bytes);
#endif
  fseek( fd_, 4, SEEK_SET ); // jump to file size
  fwrite( &bytes, 4, 1, fd_ );

  if ( useExtensible ) { // fill in the "fact" chunk frames value
    bytes = (SINT32) frameCounter_;
#ifndef __LITTLE_ENDIAN__
    swap32((unsigned char *)&bytes);
#endif
    fseek( fd_, 68, SEEK_SET );
    fwrite( &bytes, 4, 1, fd_ );
  }

  fclose( fd_ );
}